

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O1

Result_t * __thiscall Kumu::DirScannerEx::Close(Result_t *__return_storage_ptr__,DirScannerEx *this)

{
  int iVar1;
  int *piVar2;
  ILogSink *pIVar3;
  char *pcVar4;
  undefined1 *rhs;
  
  if ((DIR *)this->m_Handle == (DIR *)0x0) {
    rhs = RESULT_FILEOPEN;
  }
  else {
    iVar1 = closedir((DIR *)this->m_Handle);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if ((*piVar2 == 9) || (*piVar2 == 4)) {
        pIVar3 = DefaultLogSink();
        ILogSink::Error(pIVar3,"RESULT_STATE RETURNED at %s (%d)\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                        ,0x61d);
        rhs = (undefined1 *)&RESULT_STATE;
      }
      else {
        pIVar3 = DefaultLogSink();
        pcVar4 = strerror(*piVar2);
        ILogSink::Error(pIVar3,"DirScanner::Close(): %s\n",pcVar4);
        rhs = RESULT_FAIL;
      }
    }
    else {
      this->m_Handle = (DIR *)0x0;
      rhs = RESULT_OK;
    }
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)rhs);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::DirScannerEx::Close()
{
  if ( m_Handle == NULL )
    return RESULT_FILEOPEN;

  if ( closedir(m_Handle) == -1 )
    {
      switch ( errno )
	{
	case EBADF:
	case EINTR:
	  KM_RESULT_STATE_HERE();
	  return RESULT_STATE;

	default:
	  DefaultLogSink().Error("DirScanner::Close(): %s\n", strerror(errno));
	  return RESULT_FAIL;
	}
    }

  m_Handle = 0;
  return RESULT_OK;
}